

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

byte_vec_t *
sfc::pack_native_tile
          (byte_vec_t *__return_storage_ptr__,index_vec_t *data,Mode mode,uint bpp,uint width,
          uint height)

{
  uint p;
  uint uVar1;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  uint plane_index;
  bool bVar3;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  undefined1 auVar4 [12];
  anon_class_1_0_00000001 local_96;
  anon_class_1_0_00000001 local_95;
  uint local_94;
  byte_vec_t plane;
  anon_class_1_0_00000001 local_6b;
  anon_class_1_0_00000001 local_6a;
  anon_class_1_0_00000001 local_69;
  string local_68;
  pointer local_48;
  size_type sStack_40;
  
  aVar2._4_4_ = in_register_0000008c;
  aVar2._0_4_ = height;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_94 = bpp;
  if (mode < (gg|snes)) {
    if ((0x11aU >> (mode & (gg|sms)) & 1) != 0) {
      if ((width != 8) || (height != 8)) {
        auVar4 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
        local_48 = local_68._M_dataplus._M_p;
        sStack_40 = local_68._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x48;
        args_00.field_1.values_ = aVar2.values_;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&plane,
                   (v10 *)
                   "programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")",
                   fmt_00,args_00);
        std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
        __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar1 = bpp >> 1;
      plane_index = 0;
      while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
        pack_native_tile::anon_class_1_0_00000001::operator()
                  ((byte_vec_t *)
                   &plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   &local_95,data,plane_index);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        plane_index = plane_index + 2;
      }
      if (local_94 != 1) {
        return __return_storage_ptr__;
      }
      pack_native_tile::anon_class_1_0_00000001::operator()(&plane,&local_96,data,0,true);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      goto LAB_001476a0;
    }
    if ((0x18c00U >> (mode & (gg|sms)) & 1) == 0) goto LAB_001476b7;
    if ((width != 8) || (height != 8)) {
      auVar4 = __cxa_allocate_exception(0x10);
      mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
      local_48 = local_68._M_dataplus._M_p;
      sStack_40 = local_68._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x48;
      args.field_1.values_ = aVar2.values_;
      args.desc_ = (unsigned_long_long)&local_48;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&plane,
                 (v10 *)"programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")"
                 ,fmt,args);
      std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
      __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp == 2) {
      pack_native_tile::anon_class_1_0_00000001::operator()(&plane,&local_95,data,0);
    }
    else {
      if (bpp != 4) {
        auVar4 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
        local_48 = local_68._M_dataplus._M_p;
        sStack_40 = local_68._M_string_length;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x30;
        args_01.field_1.values_ = aVar2.values_;
        args_01.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&plane,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",
                   fmt_01,args_01);
        std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
        __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pack_native_tile::anon_class_1_0_00000001::operator()(&plane,&local_69,data,0);
    }
  }
  else {
LAB_001476b7:
    if (mode - ngp < 2) {
      if ((width != 8) || (height != 8)) {
        auVar4 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
        local_48 = local_68._M_dataplus._M_p;
        sStack_40 = local_68._M_string_length;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x48;
        args_02.field_1.values_ = aVar2.values_;
        args_02.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&plane,
                   (v10 *)
                   "programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")",
                   fmt_02,args_02);
        std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
        __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (bpp != 2) {
        auVar4 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
        local_48 = local_68._M_dataplus._M_p;
        sStack_40 = local_68._M_string_length;
        fmt_03.size_ = 0xd;
        fmt_03.data_ = (char *)0x30;
        args_03.field_1.values_ = aVar2.values_;
        args_03.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&plane,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",
                   fmt_03,args_03);
        std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
        __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pack_native_tile::anon_class_1_0_00000001::operator()(&plane,&local_6b,data,true);
    }
    else {
      if (mode == snes_mode7) {
LAB_00147769:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (__return_storage_ptr__,data);
        return __return_storage_ptr__;
      }
      if ((2 < mode - gba) && (mode != wsc_packed)) {
        if (mode != pce_sprite) {
          return __return_storage_ptr__;
        }
        for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
          pack_native_tile::anon_class_1_0_00000001::operator()
                    ((byte_vec_t *)
                     &plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                     &local_96,data,uVar1,false);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (const_iterator)
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        return __return_storage_ptr__;
      }
      if (bpp != 4) {
        if (bpp != 8) {
          auVar4 = __cxa_allocate_exception(0x10);
          mode_abi_cxx11_(&local_68,(sfc *)(ulong)mode,auVar4._8_4_);
          local_48 = local_68._M_dataplus._M_p;
          sStack_40 = local_68._M_string_length;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x30;
          args_04.field_1.args_ = aVar2.args_;
          args_04.desc_ = (unsigned_long_long)&local_48;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&plane,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",
                     fmt_04,args_04);
          std::runtime_error::runtime_error(auVar4._0_8_,(string *)&plane);
          __cxa_throw(auVar4._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
        goto LAB_00147769;
      }
      pack_native_tile::anon_class_1_0_00000001::operator()
                (&plane,&local_6a,data,mode == wsc_packed);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (__return_storage_ptr__,&plane);
LAB_001476a0:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&plane.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

inline byte_vec_t pack_native_tile(const index_vec_t& data, Mode mode, unsigned bpp, unsigned width, unsigned height) {

  // wsc/sms/gg planar style bit planes
  auto make_4bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(32);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;
    index_t mask2 = mask1 << 1;
    index_t mask3 = mask2 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;
    unsigned shift2 = plane_index + 2;
    unsigned shift3 = plane_index + 3;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 4 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 4 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
        p[y * 4 + 2] |= ((in_data[y * 8 + x] & mask2) >> shift2) << (7 - x);
        p[y * 4 + 3] |= ((in_data[y * 8 + x] & mask3) >> shift3) << (7 - x);
      }
    }
    return p;
  };

  // snes/gameboy style bit planes
  auto make_2bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 2 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 2 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
      }
    }
    return p;
  };

  // regular bit planes
  auto make_1bit_planes = [](const index_vec_t& in_data, unsigned plane, bool reverse) {
    if (in_data.size() % 8)
      throw std::runtime_error("programmer error (in_data not multiple of 8 in make_1bit_planes)");

    size_t plane_size = in_data.size() >> 3;
    byte_vec_t p(plane_size);

    index_t mask = 1;
    for (unsigned i = 0; i < plane; ++i)
      mask <<= 1;

    for (unsigned index_b = 0, index_i = 0; index_b < plane_size; ++index_b) {
      index_t byte = 0;
      for (unsigned b = 0; b < 8; ++b) {
        if (in_data[index_i + b] & mask) {
          if (reverse)
            byte |= 1 << (7-b);
          else
            byte |= 1 << b;
        }
      }
      p[index_b] = byte;
      index_i += 8;
    }
    return p;
  };

  // gba/md style 2 pixels per byte data
  auto make_4bpp_bitpack = [](const index_vec_t& in_data, bool endian_swap) {
    if (in_data.size() % 2)
      throw std::runtime_error("programmer error (in_data not multiple of 2 in make_4bpp_bitpack)");

    byte_vec_t bv(in_data.size() >> 1);
    if (endian_swap) {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[(i << 1) + 1]) | (0xf0 & (in_data[i << 1] << 4));

    } else {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[i << 1]) | (0xf0 & (in_data[(i << 1) + 1] << 4));

    }
    return bv;
  };

  // vb/ngp style 4 pixels per byte data
  auto make_2bpp_bitpack = [](const index_vec_t& in_data, bool reverse) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        unsigned px = reverse ? 7 - x : x;
        p[(y << 1) | (px >> 2)] |= (in_data[y * 8 + x] & 0x03) << ((px << 1) & 6);
      }
    }
    return p;
  };

  byte_vec_t nd;

  if (mode == Mode::snes || mode == Mode::gb || mode == Mode::gbc || mode == Mode::pce) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    unsigned planes = bpp >> 1;
    for (unsigned i = 0; i < planes; ++i) {
      auto plane = make_2bit_planes(data, i * 2);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
    // 1bpp had 0 iterations
    if(bpp == 1) {
      auto plane = make_1bit_planes(data, 0, true);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }

  } else if (mode == Mode::ws || mode == Mode::wsc || mode == Mode::gg || mode == Mode::sms) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 4) {
      nd = make_4bit_planes(data, 0);
    } else if (bpp == 2) {
      nd = make_2bit_planes(data, 0);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::ngp || mode == Mode::ngpc) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 2) {
      nd = make_2bpp_bitpack(data, true);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::snes_mode7) {
    nd = data;

  } else if (mode == Mode::gba || mode == Mode::gba_affine || mode == Mode::md || mode == Mode::wsc_packed) {
    if (bpp == 8) {
      nd = data;
    } else if (bpp == 4) {
      nd = make_4bpp_bitpack(data, mode == Mode::wsc_packed);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::pce_sprite) {
    for (unsigned p = 0; p < 4; ++p) {
      auto plane = make_1bit_planes(data, p, false);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
  }

  return nd;
}